

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# res012.c
# Opt level: O2

vorbis_look_residue * res0_look(vorbis_dsp_state *vd,vorbis_info_mode *vm,vorbis_info_residue *vr)

{
  uint uVar1;
  uint uVar2;
  undefined8 *puVar3;
  void *pvVar4;
  ulong uVar5;
  void *pvVar6;
  void *pvVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  uint uVar13;
  size_t __nmemb;
  ulong uVar14;
  ulong uVar15;
  int iVar16;
  long lVar17;
  
  puVar3 = (undefined8 *)calloc(1,0x40);
  pvVar7 = vd->vi->codec_setup;
  *puVar3 = vr;
  *(int *)(puVar3 + 1) = vm->mapping;
  uVar1 = *(uint *)((long)vr + 0x14);
  *(uint *)((long)puVar3 + 0xc) = uVar1;
  lVar17 = *(long *)((long)pvVar7 + 0x1428);
  puVar3[3] = lVar17;
  lVar8 = (long)*(int *)((long)vr + 0x18) * 0x60;
  puVar3[4] = lVar17 + lVar8;
  uVar15 = *(ulong *)(lVar17 + lVar8);
  pvVar4 = calloc((long)(int)uVar1,8);
  puVar3[5] = pvVar4;
  uVar11 = 0;
  uVar5 = 0;
  if (0 < (int)uVar1) {
    uVar5 = (ulong)uVar1;
  }
  iVar12 = 0;
  uVar10 = 0;
  for (; uVar11 != uVar5; uVar11 = uVar11 + 1) {
    lVar17 = 0;
    uVar13 = *(uint *)((long)vr + uVar11 * 4 + 0x1c);
    for (uVar2 = uVar13; uVar2 != 0; uVar2 = uVar2 >> 1) {
      lVar17 = lVar17 + -1;
    }
    if ((int)lVar17 != 0) {
      __nmemb = -lVar17;
      pvVar6 = calloc(__nmemb,8);
      *(void **)((long)pvVar4 + uVar11 * 8) = pvVar6;
      for (lVar8 = 0; lVar17 + lVar8 != 0; lVar8 = lVar8 + 1) {
        if ((uVar13 >> ((uint)lVar8 & 0x1f) & 1) != 0) {
          lVar9 = (long)iVar12;
          iVar12 = iVar12 + 1;
          *(long *)(*(long *)((long)pvVar4 + uVar11 * 8) + lVar8 * 8) =
               (long)*(int *)((long)vr + lVar9 * 4 + 0x11c) * 0x60 +
               *(long *)((long)pvVar7 + 0x1428);
        }
      }
      if ((int)uVar10 < (int)__nmemb) {
        uVar10 = __nmemb & 0xffffffff;
      }
    }
  }
  *(uint *)(puVar3 + 6) = uVar1;
  iVar12 = 1;
  uVar13 = uVar1;
  while( true ) {
    iVar16 = (int)uVar15;
    if (iVar16 <= iVar12) break;
    uVar13 = uVar13 * uVar1;
    *(uint *)(puVar3 + 6) = uVar13;
    iVar12 = iVar12 + 1;
  }
  *(int *)(puVar3 + 2) = (int)uVar10;
  pvVar7 = malloc((long)(int)uVar13 * 8);
  puVar3[7] = pvVar7;
  uVar5 = 0;
  uVar11 = 0;
  if (0 < iVar16) {
    uVar11 = uVar15 & 0xffffffff;
  }
  uVar15 = 0;
  if (0 < (int)uVar13) {
    uVar15 = (ulong)uVar13;
  }
  for (; uVar5 != uVar15; uVar5 = uVar5 + 1) {
    lVar17 = (long)((int)uVar13 / (int)uVar1);
    pvVar4 = malloc((long)iVar16 << 2);
    *(void **)((long)pvVar7 + uVar5 * 8) = pvVar4;
    uVar10 = uVar5;
    for (uVar14 = 0; uVar11 != uVar14; uVar14 = uVar14 + 1) {
      lVar8 = (long)uVar10 / lVar17;
      uVar10 = (long)uVar10 % lVar17;
      lVar17 = lVar17 / (long)(int)uVar1;
      *(int *)((long)pvVar4 + uVar14 * 4) = (int)lVar8;
    }
  }
  return puVar3;
}

Assistant:

vorbis_look_residue *res0_look(vorbis_dsp_state *vd,vorbis_info_mode *vm,
			  vorbis_info_residue *vr){
  vorbis_info_residue0 *info=(vorbis_info_residue0 *)vr;
  vorbis_look_residue0 *look=(vorbis_look_residue0 *)_ogg_calloc(1,sizeof(*look));
  codec_setup_info     *ci=(codec_setup_info *)vd->vi->codec_setup;

  int j,k,acc=0;
  int dim;
  int maxstage=0;
  look->info=info;
  look->map=vm->mapping;

  look->parts=info->partitions;
  look->fullbooks=ci->fullbooks;
  look->phrasebook=ci->fullbooks+info->groupbook;
  dim=look->phrasebook->dim;

  look->partbooks=(codebook ***)_ogg_calloc(look->parts,sizeof(*look->partbooks));

  for(j=0;j<look->parts;j++){
    int stages=ilog(info->secondstages[j]);
    if(stages){
      if(stages>maxstage)maxstage=stages;
      look->partbooks[j]=(codebook **)_ogg_calloc(stages,sizeof(*look->partbooks[j]));
      for(k=0;k<stages;k++)
	if(info->secondstages[j]&(1<<k)){
	  look->partbooks[j][k]=ci->fullbooks+info->booklist[acc++];
#ifdef TRAIN_RES
	  look->training_data[k][j]=calloc(look->partbooks[j][k]->entries,
					   sizeof(***look->training_data));
#endif
	}
    }
  }

  look->partvals=look->parts;
  for(j=1;j<dim;j++)look->partvals*=look->parts;
  look->stages=maxstage;
  look->decodemap=(int **)_ogg_malloc(look->partvals*sizeof(*look->decodemap));
  for(j=0;j<look->partvals;j++){
    long val=j;
    long mult=look->partvals/look->parts;
    look->decodemap[j]=(int *)_ogg_malloc(dim*sizeof(*look->decodemap[j]));
    for(k=0;k<dim;k++){
      long deco=val/mult;
      val-=deco*mult;
      mult/=look->parts;
      look->decodemap[j][k]=deco;
    }
  }

  return(look);
}